

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 helper_rsqrts_f32_arm(float32 a,float32 b,CPUARMState *env)

{
  int iVar1;
  float32 fVar2;
  float_status *s_00;
  float32 product;
  float_status *s;
  CPUARMState *env_local;
  float32 b_local;
  float32 a_local;
  
  s_00 = &(env->vfp).standard_fp_status;
  iVar1 = float32_is_infinity(a);
  if (iVar1 == 0) {
LAB_00677650:
    iVar1 = float32_is_infinity(b);
    if (iVar1 != 0) {
      iVar1 = float32_is_zero_or_denormal(a);
      if (iVar1 != 0) goto LAB_0067766a;
    }
    fVar2 = float32_mul_arm(a,b,s_00);
    fVar2 = float32_sub_arm(0x40400000,fVar2,s_00);
    b_local = float32_div_arm(fVar2,0x40000000,s_00);
  }
  else {
    iVar1 = float32_is_zero_or_denormal(b);
    if (iVar1 == 0) goto LAB_00677650;
LAB_0067766a:
    iVar1 = float32_is_zero(a);
    if (iVar1 == 0) {
      iVar1 = float32_is_zero(b);
      if (iVar1 == 0) {
        float_raise_arm('@',s_00);
      }
    }
    b_local = 0x3fc00000;
  }
  return b_local;
}

Assistant:

float32 HELPER(rsqrts_f32)(float32 a, float32 b, CPUARMState *env)
{
    float_status *s = &env->vfp.standard_fp_status;
    float32 product;
    if ((float32_is_infinity(a) && float32_is_zero_or_denormal(b)) ||
        (float32_is_infinity(b) && float32_is_zero_or_denormal(a))) {
        if (!(float32_is_zero(a) || float32_is_zero(b))) {
            float_raise(float_flag_input_denormal, s);
        }
        return float32_one_point_five;
    }
    product = float32_mul(a, b, s);
    return float32_div(float32_sub(float32_three, product, s), float32_two, s);
}